

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

string * phosg::load_file(string *__return_storage_ptr__,string *filename)

{
  uint uVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  scoped_fd fd;
  scoped_fd local_134;
  runtime_error *local_130;
  uint *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  size_type local_90;
  
  scoped_fd::scoped_fd(&local_134,filename,0,0x1ed);
  fstat((int)&local_c0,(stat *)(ulong)(uint)local_134.fd);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,local_90,'\0');
  sVar2 = ::read(local_134.fd,(__return_storage_ptr__->_M_dataplus)._M_p,
                 __return_storage_ptr__->_M_string_length);
  if (sVar2 == local_90) {
    scoped_fd::~scoped_fd(&local_134);
    return __return_storage_ptr__;
  }
  local_128 = (uint *)__errno_location();
  uVar1 = *local_128;
  local_130 = (runtime_error *)__cxa_allocate_exception(0x10);
  if (uVar1 == 0) {
    string_printf_abi_cxx11_
              (&local_c0,"can\'t read from %s: %zd/%zd bytes read",(filename->_M_dataplus)._M_p,
               sVar2,local_90);
    ::std::runtime_error::runtime_error(local_130,(string *)&local_c0);
    __cxa_throw(local_130,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::operator+(&local_e0,"can\'t read from ",filename);
  pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0
                      ,": ");
  local_120._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar4) {
    local_120.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_120._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  string_for_error_abi_cxx11_(&local_100,(phosg *)(ulong)*local_128,(int)local_120._M_string_length)
  ;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   &local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
  ::std::runtime_error::runtime_error(local_130,(string *)&local_c0);
  __cxa_throw(local_130,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string load_file(const string& filename) {
  scoped_fd fd(filename, O_RDONLY);
  ssize_t file_size = fstat(fd).st_size;

  string data(file_size, 0);
  ssize_t bytes_read = ::read(fd, data.data(), data.size());
  if (bytes_read != file_size) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t read from %s: %zd/%zd bytes read",
          filename.c_str(), bytes_read, file_size));
    } else {
      throw runtime_error("can\'t read from " + filename + ": " + string_for_error(errno));
    }
  }

  return data;
}